

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O0

void __thiscall
jsoncons::
index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::
index_key_value<std::basic_string_view<char,std::char_traits<char>>const&,jsoncons::semantic_tag&>
          (index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,key_type *Name,int64_t Index,basic_string_view<char,_std::char_traits<char>_> *args
          ,semantic_tag *args_1)

{
  semantic_tag tag;
  allocator_type *in_RCX;
  undefined8 in_RDX;
  string *in_RSI;
  string *in_RDI;
  string_view_type *sv;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffc0;
  undefined1 local_29 [17];
  undefined8 local_18;
  
  local_29._9_8_ = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined8 *)(in_RDI + 0x20) = local_18;
  tag = none;
  sv = (string_view_type *)local_29;
  std::allocator<char>::allocator();
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
            (in_stack_ffffffffffffffc0,sv,tag,(allocator_type *)local_29._9_8_);
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  return;
}

Assistant:

index_key_value(key_type&& Name, int64_t Index, Args&& ... args) 
            : name(std::move(Name)), index(Index), value(std::forward<Args>(args)...)
        {
        }